

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.h
# Opt level: O3

void __thiscall Room::resizeAccess(Room *this)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  lVar6 = (long)this->specialAccessedUsers_count;
  iVar2 = this->specialAccessedUsers_count * 2;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar5 = (long)iVar2 << 2;
  }
  puVar3 = (uint *)operator_new__(uVar5);
  if (0 < lVar6) {
    puVar1 = this->specialAccessedUsers;
    lVar4 = 0;
    do {
      puVar3[lVar4] = puVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar4);
  }
  this->specialAccessedUsers_count = iVar2;
  this->specialAccessedUsers = puVar3;
  return;
}

Assistant:

void resizeAccess(){
        unsigned int* newSpecialAccessedUsers = new unsigned int[specialAccessedUsers_count*2];
        for(int i=0;i<specialAccessedUsers_count;i++){
            newSpecialAccessedUsers[i] = specialAccessedUsers[i];
        }
        specialAccessedUsers_count<<=1;
        specialAccessedUsers = newSpecialAccessedUsers;
    }